

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O3

int __thiscall Fl_Text_Display::wrap_uses_character(Fl_Text_Display *this,int lineEndPos)

{
  uint uVar1;
  
  if (this->mContinuousWrap == 0) {
    return 1;
  }
  if (this->mBuffer->mLength == lineEndPos) {
    return 1;
  }
  uVar1 = Fl_Text_Buffer::char_at(this->mBuffer,lineEndPos);
  if (uVar1 != 0x20) {
    if (uVar1 == 10) {
      return 1;
    }
    if (uVar1 != 9) {
      return 0;
    }
  }
  return (uint)(lineEndPos + 1 < this->mBuffer->mLength);
}

Assistant:

int Fl_Text_Display::wrap_uses_character(int lineEndPos) const {
  IS_UTF8_ALIGNED2(buffer(), lineEndPos)

  unsigned int c;

  if (!mContinuousWrap || lineEndPos == buffer()->length())
    return 1;

  c = buffer()->char_at(lineEndPos);
  return c == '\n' || ((c == '\t' || c == ' ') &&
                       lineEndPos + 1 < buffer()->length());
}